

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.cpp
# Opt level: O2

void __thiscall CSHA256::Finalize(CSHA256 *this,uchar *hash)

{
  ulong uVar1;
  long lVar2;
  uint64_t uVar3;
  long in_FS_OFFSET;
  uchar sizedesc [8];
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = this->bytes;
  uVar1 = uVar3 * 8;
  sizedesc = (uchar  [8])
             (uVar1 >> 0x38 | (uVar1 & 0xff000000000000) >> 0x28 | (uVar1 & 0xff0000000000) >> 0x18
              | (uVar1 & 0xff00000000) >> 8 | (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18
              | (uVar1 & 0xff00) << 0x28 | uVar3 << 0x3b);
  Write(this,Finalize::pad,(ulong)(0x37U - (int)uVar3 & 0x3f) + 1);
  Write(this,sizedesc,8);
  WriteBE32(hash,this->s[0]);
  WriteBE32(hash + 4,this->s[1]);
  WriteBE32(hash + 8,this->s[2]);
  WriteBE32(hash + 0xc,this->s[3]);
  WriteBE32(hash + 0x10,this->s[4]);
  WriteBE32(hash + 0x14,this->s[5]);
  WriteBE32(hash + 0x18,this->s[6]);
  WriteBE32(hash + 0x1c,this->s[7]);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CSHA256::Finalize(unsigned char hash[OUTPUT_SIZE])
{
    static const unsigned char pad[64] = {0x80};
    unsigned char sizedesc[8];
    WriteBE64(sizedesc, bytes << 3);
    Write(pad, 1 + ((119 - (bytes % 64)) % 64));
    Write(sizedesc, 8);
    WriteBE32(hash, s[0]);
    WriteBE32(hash + 4, s[1]);
    WriteBE32(hash + 8, s[2]);
    WriteBE32(hash + 12, s[3]);
    WriteBE32(hash + 16, s[4]);
    WriteBE32(hash + 20, s[5]);
    WriteBE32(hash + 24, s[6]);
    WriteBE32(hash + 28, s[7]);
}